

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::AnyPointer::Pipeline> * __thiscall
kj::_::NullableValue<capnp::AnyPointer::Pipeline>::operator=
          (NullableValue<capnp::AnyPointer::Pipeline> *this,
          NullableValue<capnp::AnyPointer::Pipeline> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      capnp::AnyPointer::Pipeline::~Pipeline(&(this->field_1).value);
    }
    if (other->isSet == true) {
      capnp::AnyPointer::Pipeline::Pipeline(&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }